

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginMenuEx(char *label,char *icon,bool enabled)

{
  float fVar1;
  ImVec2 IVar2;
  int iVar3;
  ImGuiWindow *this;
  ImDrawList *draw_list;
  ImGuiPopupData *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ImGuiID id;
  ImU32 col;
  uint *__dest;
  bool bVar10;
  int iVar11;
  byte bVar12;
  uint *puVar13;
  long lVar14;
  int iVar15;
  byte bVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  ImVec2 IVar20;
  ImVec2 pos;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar21;
  float fVar22;
  float fVar23;
  ImVec2 ta;
  ImVec2 local_a8;
  ImVec2 local_9c;
  float local_94;
  uint local_90;
  uint local_8c;
  undefined1 local_88 [16];
  ImGuiWindow *local_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    bVar7 = IsPopupOpen(id,0);
    local_8c = (uint)((*(byte *)((long)&this->Flags + 3) & 0x10) >> 4) << 0x18 | 0x10080145;
    __dest = (pIVar6->MenusIdSubmittedThisFrame).Data;
    iVar3 = (pIVar6->MenusIdSubmittedThisFrame).Size;
    lVar14 = (long)iVar3;
    puVar13 = __dest;
    do {
      if (__dest + lVar14 <= puVar13) {
        if (iVar3 == (pIVar6->MenusIdSubmittedThisFrame).Capacity) {
          if (iVar3 == 0) {
            iVar11 = 8;
          }
          else {
            iVar11 = iVar3 / 2 + iVar3;
          }
          iVar15 = iVar3 + 1;
          if (iVar3 + 1 < iVar11) {
            iVar15 = iVar11;
          }
          __dest = (uint *)MemAlloc((long)iVar15 << 2);
          puVar13 = (pIVar6->MenusIdSubmittedThisFrame).Data;
          if (puVar13 != (uint *)0x0) {
            memcpy(__dest,puVar13,(long)(pIVar6->MenusIdSubmittedThisFrame).Size << 2);
            MemFree((pIVar6->MenusIdSubmittedThisFrame).Data);
          }
          (pIVar6->MenusIdSubmittedThisFrame).Data = __dest;
          (pIVar6->MenusIdSubmittedThisFrame).Capacity = iVar15;
          lVar14 = (long)(pIVar6->MenusIdSubmittedThisFrame).Size;
        }
        __dest[lVar14] = id;
        (pIVar6->MenusIdSubmittedThisFrame).Size = (pIVar6->MenusIdSubmittedThisFrame).Size + 1;
        IVar20 = CalcTextSize(label,(char *)0x0,true,-1.0);
        local_88._8_8_ = extraout_XMM0_Qb;
        local_88._0_4_ = IVar20.x;
        local_88._4_4_ = IVar20.y;
        bVar8 = IsRootOfOpenMenuSet();
        local_70 = pIVar6->NavWindow;
        if (bVar8) {
          pIVar6->NavWindow = this;
        }
        fVar19 = (this->DC).CursorPos.x;
        fVar1 = (this->DC).CursorPos.y;
        PushID(label);
        if (!enabled) {
          BeginDisabled(true);
        }
        uVar17 = (uint)bVar7;
        if ((this->DC).LayoutType == 0) {
          fVar18 = (pIVar6->Style).ItemSpacing.x;
          fVar23 = (pIVar6->Style).FramePadding.y;
          local_9c.y = ImGuiWindow::MenuBarHeight(this);
          local_9c.y = local_9c.y + (fVar1 - fVar23);
          fVar1 = (pIVar6->Style).ItemSpacing.x;
          (this->DC).CursorPos.x = (float)(int)(fVar1 * 0.5) + (this->DC).CursorPos.x;
          local_a8.y = (pIVar6->Style).ItemSpacing.y;
          local_a8.x = fVar1 + fVar1;
          local_9c.x = (fVar19 + -1.0) - (float)(int)(fVar18 * 0.5);
          PushStyleVar(0xe,&local_a8);
          IVar20 = (this->DC).CursorPos;
          IVar2.y = (this->DC).CurrLineTextBaseOffset + IVar20.y;
          IVar2.x = (float)(this->DC).MenuColumns.OffsetLabel + IVar20.x;
          local_a8.y = 0.0;
          local_a8.x = (float)local_88._0_4_;
          bVar9 = Selectable("",bVar7,0x500001,&local_a8);
          RenderText(IVar2,label,(char *)0x0,true);
          PopStyleVar(1);
          (this->DC).CursorPos.x =
               (float)(int)((pIVar6->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
        }
        else {
          local_9c.y = fVar1 - (pIVar6->Style).WindowPadding.y;
          local_58 = ZEXT416(0);
          local_9c.x = fVar19;
          local_90 = uVar17;
          if ((icon != (char *)0x0) && (*icon != '\0')) {
            local_58._0_8_ = CalcTextSize(icon,(char *)0x0,false,-1.0);
            local_58._8_8_ = extraout_XMM0_Qb_00;
          }
          local_94 = ImGuiMenuColumns::DeclColumns
                               (&(this->DC).MenuColumns,local_58._0_4_,(float)local_88._0_4_,0.0,
                                (float)(int)(pIVar6->FontSize * 1.2));
          IVar20 = GetContentRegionAvail();
          fVar18 = IVar20.x - local_94;
          local_88 = ZEXT416(~-(uint)(fVar18 <= 0.0) & (uint)fVar18);
          IVar20 = (this->DC).CursorPos;
          local_68.y = (this->DC).CurrLineTextBaseOffset + IVar20.y;
          local_68.x = (float)(this->DC).MenuColumns.OffsetLabel + IVar20.x;
          uStack_60 = 0;
          local_a8.y = 0.0;
          local_a8.x = local_94;
          bVar9 = Selectable("",SUB41(local_90,0),0x1500001,&local_a8);
          RenderText(local_68,label,(char *)0x0,true);
          if (0.0 < (float)local_58._0_4_) {
            IVar20.x = (float)(this->DC).MenuColumns.OffsetIcon + fVar19;
            IVar20.y = fVar1 + 0.0;
            RenderText(IVar20,icon,(char *)0x0,true);
          }
          draw_list = this->DrawList;
          pos.x = pIVar6->FontSize * 0.3 +
                  (float)local_88._0_4_ + (float)(this->DC).MenuColumns.OffsetMark + fVar19;
          pos.y = fVar1 + 0.0;
          local_a8.x = 0.0;
          local_a8.y = 0.0;
          col = GetColorU32(0,1.0);
          RenderArrow(draw_list,pos,col,1,1.0);
        }
        if (enabled) {
          if (pIVar6->HoveredId != id) goto LAB_0016b85b;
          bVar16 = pIVar6->NavDisableMouseHover ^ 1;
        }
        else {
          EndDisabled();
LAB_0016b85b:
          bVar16 = 0;
        }
        if (bVar8) {
          pIVar6->NavWindow = local_70;
        }
        if ((this->DC).LayoutType == 1) {
          iVar3 = (pIVar6->BeginPopupStack).Size;
          if ((iVar3 < (pIVar6->OpenPopupStack).Size) &&
             (pIVar4 = (pIVar6->OpenPopupStack).Data, pIVar4[iVar3].SourceWindow == this)) {
            bVar8 = true;
            if (((pIVar6->HoveredWindow == this) &&
                (pIVar5 = pIVar4[iVar3].Window, pIVar5 != (ImGuiWindow *)0x0)) &&
               ((this->Flags & 0x400) == 0)) {
              fVar1 = pIVar6->FontSize;
              local_38.x = (pIVar5->Pos).x;
              fVar19 = (pIVar5->Pos).y;
              IVar20 = (pIVar6->IO).MousePos;
              IVar2 = (pIVar6->IO).MouseDelta;
              fVar18 = IVar20.x - IVar2.x;
              local_a8.y = IVar20.y - IVar2.y;
              if (local_38.x < (this->Pos).x || local_38.x == (this->Pos).x) {
                local_38.x = local_38.x + (pIVar5->Size).x;
                fVar23 = 0.5;
              }
              else {
                fVar23 = -0.5;
              }
              fVar21 = ABS(fVar18 - local_38.x) * 0.3;
              fVar22 = fVar1 * 2.5;
              if (fVar21 <= fVar1 * 2.5) {
                fVar22 = fVar21;
              }
              uVar17 = -(uint)(fVar21 < fVar1 * 0.5);
              fVar22 = (float)(uVar17 & (uint)(fVar1 * 0.5) | ~uVar17 & (uint)fVar22);
              local_a8.x = fVar23 + fVar18;
              fVar18 = (fVar19 - fVar22) - local_a8.y;
              uVar17 = -(uint)(fVar1 * -8.0 <= fVar18);
              local_38.y = (float)(~uVar17 & (uint)(fVar1 * -8.0) | (uint)fVar18 & uVar17) +
                           local_a8.y;
              fVar19 = ((pIVar5->Size).y + fVar19 + fVar22) - local_a8.y;
              if (fVar1 * 8.0 <= fVar19) {
                fVar19 = fVar1 * 8.0;
              }
              local_40.y = fVar19 + local_a8.y;
              local_40.x = local_38.x;
              bVar8 = ImTriangleContainsPoint(&local_a8,&local_38,&local_40,&(pIVar6->IO).MousePos);
              bVar8 = !bVar8;
            }
          }
          else {
            bVar8 = true;
          }
          if ((!bVar7 || (bVar16 & 1) != 0) || (pIVar6->HoveredWindow != this)) {
            bVar12 = 0;
          }
          else {
            bVar12 = (pIVar6->HoveredIdPreviousFrame != id && pIVar6->HoveredIdPreviousFrame != 0) &
                     bVar8;
          }
          bVar10 = (bool)(!bVar7 & bVar9);
          if ((bVar16 & 1) == 0) {
            bVar8 = bVar10;
          }
          if (bVar9 != false) {
            bVar8 = bVar10;
          }
          if (bVar7) {
            bVar8 = bVar10;
          }
          if ((pIVar6->NavId == id) && (pIVar6->NavMoveDir == 1)) {
LAB_0016b909:
            NavMoveRequestCancel();
            bVar8 = true;
          }
        }
        else if (bVar9 == false) {
          if ((byte)(bVar7 | bVar8 & bVar16 ^ 1) == 1) {
            if (pIVar6->NavId == id) {
              bVar12 = 0;
              if (pIVar6->NavMoveDir == 3) goto LAB_0016b909;
              bVar8 = false;
            }
            else {
              bVar8 = false;
              bVar12 = 0;
            }
          }
          else {
            bVar8 = true;
            bVar12 = 0;
            bVar7 = false;
          }
        }
        else {
          bVar12 = bVar8 & bVar9 & bVar7;
          bVar8 = (bool)(bVar12 ^ 1);
          bVar7 = (bool)(bVar7 ^ bVar12);
        }
        if (((!enabled) || (bVar12 != 0)) && (bVar9 = IsPopupOpen(id,0), bVar9)) {
          ClosePopupToLevel((pIVar6->BeginPopupStack).Size,true);
        }
        PopID();
        if (((~bVar8 & 1U) == 0 && bVar7 == false) &&
           ((pIVar6->BeginPopupStack).Size < (pIVar6->OpenPopupStack).Size)) {
          OpenPopup(label,0);
          return false;
        }
        if (bVar8 == false) {
          if (bVar7 == false) goto LAB_0016bae0;
        }
        else {
          OpenPopup(label,0);
        }
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        SetNextWindowPos(&local_9c,1,&local_a8);
        PushStyleVar(7,(pIVar6->Style).PopupRounding);
        bVar7 = BeginPopupEx(id,local_8c);
        PopStyleVar(1);
        return bVar7;
      }
      uVar17 = *puVar13;
      puVar13 = puVar13 + 1;
    } while (uVar17 != id);
    if (bVar7) {
      bVar7 = BeginPopupEx(id,local_8c);
      return bVar7;
    }
LAB_0016bae0:
    (pIVar6->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}